

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuid_tool.c
# Opt level: O2

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  FILE *pFVar3;
  cpu_id_t *pcVar4;
  cpu_raw_data_t *pcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  size_t sVar12;
  undefined8 uVar13;
  char cVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  output_data_switch *poVar18;
  char *pcVar19;
  FILE *__stream;
  long lVar20;
  int i;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  size_t sStack_a0;
  system_id_t data;
  int local_70;
  int local_6c;
  cpu_raw_data_array_t raw_array;
  cpu_list_t list;
  
  iVar9 = 1;
  if (argc == 1) {
    builtin_strncpy(raw_data_file,"raw.txt",8);
    builtin_strncpy(out_file,"report.txt",0xb);
    need_output = iVar9;
    need_report = iVar9;
    verbose_level = iVar9;
  }
  else {
    local_6c = need_input;
    local_70 = need_output;
    iVar9 = verbose_level;
    iVar11 = num_requests;
    for (lVar20 = 1; iVar8 = 1, lVar20 < argc; lVar20 = lVar20 + 1) {
      pcVar17 = argv[lVar20];
      if ((((*pcVar17 == '-') && (pcVar17[1] == 'h')) && (pcVar17[2] == '\0')) ||
         (iVar6 = strcmp(pcVar17,"--help"), iVar6 == 0)) {
        puts("Usage: cpuid_tool [options]\n");
        puts("Options:");
        puts("  -h, --help       - Show this help");
        puts("  --load=<file>    - Load raw CPUID data from file");
        puts("  --save=<file>    - Acquire raw CPUID data and write it to file");
        puts("  --report, --all  - Report all decoded CPU info (w/o clock)");
        puts("  --clock          - in conjunction to --report: print CPU clock as well");
        puts("  --clock-rdtsc    - same as --clock, but use RDTSC for clock detection");
        puts("  --cpulist        - list all known CPUs");
        puts("  --sgx            - list SGX leaf data, if SGX is supported.");
        puts("  --hypervisor     - print hypervisor vendor if detected.");
        puts("  --quiet          - disable warnings");
        puts("  --outfile=<file> - redirect all output to this file, instead of stdout");
        puts("  --verbose, -v    - be extra verbose (more keys increase verbosiness level)");
        puts("  --version        - print library version");
        putchar(10);
        printf("Query switches (generate 1 line of output per switch; in order of appearance):");
        iVar9 = 0x50;
        for (lVar20 = -0x4b0; lVar20 != 0; lVar20 = lVar20 + 0x18) {
          pcVar17 = *(char **)((long)&DAT_00107b78 + lVar20);
          sVar12 = strlen(pcVar17);
          if (0x4c < (int)sVar12 + iVar9) {
            printf("\n  ");
            iVar9 = 2;
          }
          printf("%s",pcVar17);
          if (lVar20 != -0x18) {
            iVar9 = iVar9 + (int)sVar12 + 2;
            printf(", ");
          }
        }
        puts("\n");
        puts("If `-\' is used for <file>, then stdin/stdout will be used instead of files.");
        puts("When no options are present, the program behaves as if it was invoked with");
        puts("  cpuid_tool \"--save=raw.txt --outfile=report.txt --report --verbose\"");
        bVar2 = false;
        iVar9 = 0;
        goto LAB_0010290c;
      }
      iVar7 = strncmp(pcVar17,"--load=",7);
      iVar6 = 0;
      if (iVar7 == 0) {
        if (local_6c == 0) {
          if (local_70 == 0) {
            sVar12 = strlen(pcVar17);
            if (7 < sVar12) {
              need_input = 1;
              strcpy(raw_data_file,pcVar17 + 7);
              iVar6 = iVar8;
              local_6c = iVar8;
              goto LAB_00102508;
            }
            pcVar17 = "--load: bad file specification!";
          }
          else {
LAB_00103698:
            pcVar17 = "Cannot have both `--load\' and `--save\' options!";
          }
        }
        else {
          pcVar17 = "Too many `--load\' options!";
        }
LAB_001037a6:
        pcVar19 = "Error: %s\n\n";
LAB_001037a8:
        bVar2 = false;
        fprintf(_stderr,pcVar19,pcVar17);
        fwrite("Use -h to get a list of supported options\n",0x2a,1,_stderr);
        iVar9 = -1;
        goto LAB_0010290c;
      }
LAB_00102508:
      iVar7 = strncmp(pcVar17,"--save=",7);
      if (iVar7 == 0) {
        if (local_70 == 0) {
          if (local_6c != 0) goto LAB_00103698;
          sVar12 = strlen(pcVar17);
          if (7 < sVar12) {
            need_output = 1;
            strcpy(raw_data_file,pcVar17 + 7);
            iVar6 = iVar8;
            local_70 = iVar8;
            goto LAB_00102568;
          }
          pcVar17 = "--save: bad file specification!";
        }
        else {
          pcVar17 = "Too many `--save\' options!";
        }
        goto LAB_001037a6;
      }
LAB_00102568:
      iVar7 = strncmp(pcVar17,"--outfile=",10);
      if (iVar7 == 0) {
        sVar12 = strlen(pcVar17);
        if (sVar12 < 0xb) {
          pcVar17 = "--output: bad file specification!";
          goto LAB_001037a6;
        }
        strcpy(out_file,pcVar17 + 10);
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--report");
      if ((iVar7 == 0) || (iVar7 = strcmp(pcVar17,"--all"), iVar7 == 0)) {
        need_report = 1;
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--clock");
      if (iVar7 == 0) {
        need_clockreport = 1;
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--clock-rdtsc");
      if (iVar7 == 0) {
        iVar6 = iVar8;
        need_clockreport = iVar8;
        need_timed_clockreport = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--quiet");
      if (iVar7 == 0) {
        need_quiet = 1;
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--verbose");
      if (iVar7 == 0) {
        iVar9 = iVar9 + 1;
        iVar6 = iVar8;
        verbose_level = iVar9;
      }
      iVar7 = strcmp(pcVar17,"--version");
      if (iVar7 == 0) {
        need_version = 1;
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--cpulist");
      if (iVar7 == 0) {
        need_cpulist = 1;
        iVar6 = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--sgx");
      if (iVar7 == 0) {
        iVar6 = iVar8;
        need_sgx = iVar8;
        need_identify = iVar8;
      }
      iVar7 = strcmp(pcVar17,"--hypervisor");
      if (iVar7 == 0) {
        iVar6 = iVar8;
        need_hypervisor = iVar8;
        need_identify = iVar8;
      }
      if ((*pcVar17 == '-') && (pcVar17[1] == 'v')) {
        lVar16 = 0;
        cVar14 = 'v';
        while (cVar14 == 'v') {
          lVar15 = lVar16 + 2;
          lVar16 = lVar16 + 1;
          cVar14 = pcVar17[lVar15];
        }
        if (cVar14 == '\0') {
          iVar9 = iVar9 + (int)lVar16;
          iVar6 = 1;
          verbose_level = iVar9;
        }
      }
      lVar16 = 8;
      do {
        lVar15 = lVar16;
        if (lVar15 + 0x18 == 0x4d0) {
          if (iVar6 != 0) goto LAB_0010276f;
          pcVar19 = "Unrecognized option: `%s\'\n\n";
          goto LAB_001037a8;
        }
        iVar8 = strcmp(pcVar17,*(char **)((long)&matchtable[0].sw + lVar15));
        lVar16 = lVar15 + 0x18;
      } while (iVar8 != 0);
      if (0x3f < iVar11) {
        pcVar17 = "Too many requests!";
        goto LAB_001037a6;
      }
      lVar16 = (long)iVar11;
      iVar11 = iVar11 + 1;
      num_requests = iVar11;
      requests[lVar16] =
           *(output_data_switch *)((long)&__do_global_dtors_aux_fini_array_entry + lVar15);
LAB_0010276f:
    }
  }
  iVar9 = 1;
  bVar2 = true;
LAB_0010290c:
  raw_array.with_affinity = false;
  raw_array._1_1_ = 0;
  raw_array.num_raw = 0;
  raw_array._4_4_ = 0;
  raw_array.raw = (cpu_raw_data_t *)0x0;
  data.l1_data_total_instances = 0;
  data.l1_instruction_total_instances = 0;
  data.l2_total_instances = 0;
  data.l3_total_instances = 0;
  data.num_cpu_types = '\0';
  data._1_7_ = 0;
  data.cpu_types = (cpu_id_t *)0x0;
  data.l4_total_instances = 0;
  data._36_4_ = 0;
  if (!bVar2) {
    return iVar9;
  }
  if (need_quiet != 0) {
    cpuid_set_warn_function(0);
  }
  cpuid_set_verbosiness_level(verbose_level);
  if ((out_file[0] == '\0') || (CONCAT11(out_file[1],out_file[0]) == 0x2d)) {
    fout = _stdout;
  }
  else {
    fout = (FILE *)fopen(out_file,"wt");
    if ((FILE *)fout == (FILE *)0x0) {
      if (need_quiet != 0) {
        return -1;
      }
      pcVar19 = "Cannot open `%s\' for writing!\n";
      pcVar17 = out_file;
      __stream = _stderr;
      goto LAB_0010371a;
    }
    atexit(close_out);
  }
  pFVar3 = fout;
  if (need_version != 0) {
    uVar13 = cpuid_lib_version();
    fprintf((FILE *)pFVar3,"%s\n",uVar13);
  }
  if (need_input == 0) {
    iVar9 = check_need_raw_data();
    if ((iVar9 == 0) || (iVar9 = cpuid_get_all_raw_data(&raw_array), -1 < iVar9)) goto LAB_00102a5c;
    if (need_quiet != 0) {
      return -1;
    }
    pcVar17 = "Cannot obtain raw CPU data!\n";
    sStack_a0 = 0x1c;
LAB_00103222:
    fwrite(pcVar17,sStack_a0,1,_stderr);
  }
  else {
    pcVar17 = "";
    if (raw_data_file._0_2_ != 0x2d) {
      pcVar17 = raw_data_file;
    }
    iVar9 = cpuid_deserialize_all_raw_data(&raw_array,pcVar17);
    if (-1 < iVar9) {
LAB_00102a5c:
      if (need_output != 0) {
        pcVar17 = "";
        if (raw_data_file._0_2_ != 0x2d) {
          pcVar17 = raw_data_file;
        }
        iVar9 = cpuid_serialize_all_raw_data(&raw_array,pcVar17);
        if (iVar9 < 0) {
          if (need_quiet != 0) {
            return -1;
          }
          fwrite("Cannot serialize raw data to ",0x1d,1,_stderr);
          if (raw_data_file._0_2_ == 0x2d) {
            pcVar17 = "stdout\n";
            sStack_a0 = 7;
            goto LAB_00103222;
          }
          goto LAB_001036ed;
        }
      }
      if (need_report != 0) {
        if (0 < verbose_level) {
          printf("Writing decoded CPU report to `%s\'\n",out_file);
        }
        iVar9 = cpu_identify_all(&raw_array,&data);
        pFVar3 = fout;
        if (iVar9 < 0) {
          uVar13 = cpuid_error();
          fprintf((FILE *)pFVar3,"Error identifying the CPU: %s\n",uVar13);
        }
        else if (data.num_cpu_types == '\0') {
          fwrite("The cpu_types array is empty: there is nothing to report\n",0x39,1,(FILE *)fout);
        }
        else {
          fwrite("CPUID is present\n",0x11,1,(FILE *)fout);
          lVar20 = 0x5c;
          for (uVar21 = 0; uVar21 < (data._0_8_ & 0xff); uVar21 = uVar21 + 1) {
            fprintf((FILE *)fout,"CPU Info for type #%d:\n------------------\n",uVar21 & 0xffffffff)
            ;
            pFVar3 = fout;
            uVar13 = cpu_architecture_str(data.cpu_types[uVar21].architecture);
            fprintf((FILE *)pFVar3,"  arch       : %s\n",uVar13);
            pFVar3 = fout;
            uVar13 = cpu_feature_level_str(data.cpu_types[uVar21].feature_level);
            fprintf((FILE *)pFVar3,"  feat_level : %s\n",uVar13);
            pFVar3 = fout;
            uVar13 = cpu_purpose_str(data.cpu_types[uVar21].purpose);
            fprintf((FILE *)pFVar3,"  purpose    : %s\n",uVar13);
            fprintf((FILE *)fout,"  vendor_str : `%s\'\n",data.cpu_types[uVar21].vendor_str);
            fprintf((FILE *)fout,"  vendor id  : %d\n",(ulong)(uint)data.cpu_types[uVar21].vendor);
            fprintf((FILE *)fout,"  brand_str  : `%s\'\n",data.cpu_types[uVar21].brand_str);
            if (data.cpu_types[uVar21].architecture == ARCHITECTURE_ARM) {
              fprintf((FILE *)fout,"  implementer: %d (%02Xh)\n",
                      (ulong)data.cpu_types[uVar21].field_11.arm.implementer);
              fprintf((FILE *)fout,"  variant    : %d (%02Xh)\n",
                      (ulong)data.cpu_types[uVar21].field_11.arm.variant);
              fprintf((FILE *)fout,"  part_num   : %d (%02Xh)\n",
                      (ulong)data.cpu_types[uVar21].field_11.arm.part_num);
              uVar22 = (ulong)data.cpu_types[uVar21].field_11.arm.revision;
              pcVar17 = "  revision   : %d (%02Xh)\n";
LAB_00102d53:
              fprintf((FILE *)fout,pcVar17,uVar22);
            }
            else if (data.cpu_types[uVar21].architecture == ARCHITECTURE_X86) {
              fprintf((FILE *)fout,"  family     : %d (%02Xh)\n",
                      (ulong)(uint)data.cpu_types[uVar21].field_11.x86.family);
              fprintf((FILE *)fout,"  model      : %d (%02Xh)\n",
                      (ulong)(uint)data.cpu_types[uVar21].field_11.x86.model);
              fprintf((FILE *)fout,"  stepping   : %d (%02Xh)\n",
                      (ulong)(uint)data.cpu_types[uVar21].field_11.x86.stepping);
              fprintf((FILE *)fout,"  ext_family : %d (%02Xh)\n",
                      (ulong)(uint)data.cpu_types[uVar21].field_11.x86.ext_family);
              uVar22 = (ulong)(uint)data.cpu_types[uVar21].field_11.x86.ext_model;
              pcVar17 = "  ext_model  : %d (%02Xh)\n";
              goto LAB_00102d53;
            }
            fprintf((FILE *)fout,"  num_cores  : %d\n",(ulong)(uint)data.cpu_types[uVar21].num_cores
                   );
            fprintf((FILE *)fout,"  num_logical: %d\n",
                    (ulong)(uint)data.cpu_types[uVar21].num_logical_cpus);
            fprintf((FILE *)fout,"  tot_logical: %d\n",
                    (ulong)(uint)data.cpu_types[uVar21].total_logical_cpus);
            pFVar3 = fout;
            uVar13 = affinity_mask_str(&data.cpu_types[uVar21].affinity_mask);
            fprintf((FILE *)pFVar3,"  affi_mask  : 0x%s\n",uVar13);
            if (data.cpu_types[uVar21].architecture == ARCHITECTURE_X86) {
              fprintf((FILE *)fout,"  L1 D cache : %d KB\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_data_cache);
              fprintf((FILE *)fout,"  L1 I cache : %d KB\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_instruction_cache);
              fprintf((FILE *)fout,"  L2 cache   : %d KB\n",
                      (ulong)(uint)data.cpu_types[uVar21].l2_cache);
              fprintf((FILE *)fout,"  L3 cache   : %d KB\n",
                      (ulong)(uint)data.cpu_types[uVar21].l3_cache);
              fprintf((FILE *)fout,"  L4 cache   : %d KB\n",
                      (ulong)(uint)data.cpu_types[uVar21].l4_cache);
              fprintf((FILE *)fout,"  L1D assoc. : %d-way\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_data_assoc);
              fprintf((FILE *)fout,"  L1I assoc. : %d-way\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_instruction_assoc);
              fprintf((FILE *)fout,"  L2 assoc.  : %d-way\n",
                      (ulong)(uint)data.cpu_types[uVar21].l2_assoc);
              fprintf((FILE *)fout,"  L3 assoc.  : %d-way\n",
                      (ulong)(uint)data.cpu_types[uVar21].l3_assoc);
              fprintf((FILE *)fout,"  L4 assoc.  : %d-way\n",
                      (ulong)(uint)data.cpu_types[uVar21].l4_assoc);
              fprintf((FILE *)fout,"  L1D line sz: %d bytes\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_data_cacheline);
              fprintf((FILE *)fout,"  L1I line sz: %d bytes\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_instruction_cacheline);
              fprintf((FILE *)fout,"  L2 line sz : %d bytes\n",
                      (ulong)(uint)data.cpu_types[uVar21].l2_cacheline);
              fprintf((FILE *)fout,"  L3 line sz : %d bytes\n",
                      (ulong)(uint)data.cpu_types[uVar21].l3_cacheline);
              fprintf((FILE *)fout,"  L4 line sz : %d bytes\n",
                      (ulong)(uint)data.cpu_types[uVar21].l4_cacheline);
              fprintf((FILE *)fout,"  L1D inst.  : %d\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_data_instances);
              fprintf((FILE *)fout,"  L1I inst.  : %d\n",
                      (ulong)(uint)data.cpu_types[uVar21].l1_instruction_instances);
              fprintf((FILE *)fout,"  L2 inst.   : %d\n",
                      (ulong)(uint)data.cpu_types[uVar21].l2_instances);
              fprintf((FILE *)fout,"  L3 inst.   : %d\n",
                      (ulong)(uint)data.cpu_types[uVar21].l3_instances);
              fprintf((FILE *)fout,"  L4 inst.   : %d\n",
                      (ulong)(uint)data.cpu_types[uVar21].l4_instances);
              pcVar17 = "authoritative";
              if (data.cpu_types[uVar21].detection_hints[0] == '\0') {
                pcVar17 = "non-authoritative";
              }
              fprintf((FILE *)fout,"  SSE units  : %d bits (%s)\n",
                      (ulong)(uint)data.cpu_types[uVar21].field_11.x86.sse_size,pcVar17);
            }
            fprintf((FILE *)fout,"  code name  : `%s\'\n",data.cpu_types[uVar21].cpu_codename);
            fwrite("  features   :",0xe,1,(FILE *)fout);
            for (uVar22 = 0; pFVar3 = fout, uVar22 != 0x150; uVar22 = uVar22 + 1) {
              if ((data.cpu_types)->vendor_str[uVar22 + lVar20 + -8] != '\0') {
                uVar13 = cpu_feature_str(uVar22 & 0xffffffff);
                fprintf((FILE *)pFVar3," %s",uVar13);
              }
            }
            fputc(10,(FILE *)fout);
            lVar20 = lVar20 + 9000;
          }
        }
        pFVar3 = fout;
        if (need_clockreport != 0) {
          if (need_timed_clockreport == 0) {
            uVar10 = cpu_clock();
          }
          else {
            uVar10 = cpu_clock_measure(400,1);
          }
          fprintf((FILE *)pFVar3,"  cpu clock  : %d MHz\n",(ulong)uVar10);
        }
      }
      iVar9 = num_requests;
      uVar21 = 0;
      uVar22 = 0;
      if (0 < num_requests) {
        uVar22 = (ulong)(uint)num_requests;
      }
      for (poVar18 = requests;
          (uVar22 != uVar21 && ((*poVar18 == NEED_CLOCK_RDTSC || (*poVar18 == NEED_CLOCK))));
          poVar18 = poVar18 + 1) {
        uVar21 = uVar21 + 1;
      }
      if ((num_requests < 1 || need_report != 0 && (long)num_requests <= (long)uVar21) &&
         (need_identify == 0)) {
LAB_001032e4:
        if (need_cpulist != 0) {
          for (lVar20 = 0; lVar20 != 0x1c; lVar20 = lVar20 + 1) {
            fprintf((FILE *)fout,"-----%s-----\n",(&PTR_anon_var_dwarf_d43_00107b70)[lVar20 * 2]);
            cpuid_get_cpu_list((&DAT_00107b78)[lVar20 * 4],&list);
            for (lVar16 = 0; lVar16 < list.num_entries; lVar16 = lVar16 + 1) {
              fprintf((FILE *)fout,"%s\n",list.names[lVar16]);
            }
            cpuid_free_cpu_list(&list);
          }
        }
        pcVar5 = raw_array.raw;
        pcVar4 = data.cpu_types;
        if (need_sgx != 0) {
          uVar10 = ((data.cpu_types)->field_11).x86.sgx.present;
          pcVar19 = "present";
          pcVar17 = "present";
          if (uVar10 == 0) {
            pcVar17 = "absent";
          }
          fprintf((FILE *)fout,"SGX: %d (%s)\n",(ulong)uVar10,pcVar17);
          if ((pcVar4->field_11).x86.sgx.present != 0) {
            fprintf((FILE *)fout,"SGX max enclave size (32-bit): 2^%d\n",
                    (ulong)*(byte *)((long)&pcVar4->field_11 + 0x1c));
            fprintf((FILE *)fout,"SGX max enclave size (64-bit): 2^%d\n",
                    (ulong)*(byte *)((long)&pcVar4->field_11 + 0x1d));
            bVar1 = *(byte *)((long)&pcVar4->field_11 + 0x1e);
            pcVar17 = "present";
            if (bVar1 == 0) {
              pcVar17 = "absent";
            }
            fprintf((FILE *)fout,"SGX1 extensions              : %d (%s)\n",(ulong)bVar1,pcVar17);
            bVar1 = *(byte *)((long)&pcVar4->field_11 + 0x1f);
            if (bVar1 == 0) {
              pcVar19 = "absent";
            }
            fprintf((FILE *)fout,"SGX2 extensions              : %d (%s)\n",(ulong)bVar1,pcVar19);
            fprintf((FILE *)fout,"SGX MISCSELECT               : %08x\n",
                    (ulong)(pcVar4->field_11).x86.sgx.misc_select);
            fprintf((FILE *)fout,"SGX SECS.ATTRIBUTES mask     : %016llx\n",
                    *(undefined8 *)((long)&pcVar4->field_11 + 0x38));
            fprintf((FILE *)fout,"SGX SECS.XSAVE feature mask  : %016llx\n",
                    *(undefined8 *)((long)&pcVar4->field_11 + 0x40));
            fprintf((FILE *)fout,"SGX EPC sections count       : %d\n",
                    (ulong)(uint)(pcVar4->field_11).x86.sgx.num_epc_sections);
            for (uVar10 = 0; (int)uVar10 < (pcVar4->field_11).x86.sgx.num_epc_sections;
                uVar10 = uVar10 + 1) {
              auVar23 = cpuid_get_epc(uVar10,pcVar5);
              fprintf((FILE *)fout,"    SGX EPC section #%-8d: start = %llx, size = %llu\n",
                      (ulong)uVar10,auVar23._0_8_,auVar23._8_8_);
            }
          }
        }
        if (need_hypervisor != 0) {
          iVar9 = cpuid_get_hypervisor(raw_array.raw,data.cpu_types);
          pcVar17 = (char *)0x0;
          lVar20 = -0x10;
          do {
            lVar16 = lVar20;
            if (lVar16 + 0x10 == 0x90) goto LAB_0010353d;
            lVar20 = lVar16 + 0x10;
          } while (*(int *)((long)&DAT_00107d48 + lVar16) != iVar9);
          pcVar17 = *(char **)((long)&PTR_anon_var_dwarf_f5f_00107d40 + lVar16);
LAB_0010353d:
          pcVar19 = "unknown";
          if (pcVar17 != (char *)0x0) {
            pcVar19 = pcVar17;
          }
          fprintf((FILE *)fout,"Hypervisor vendor: %s\n",pcVar19);
          if (iVar9 == 0) {
            fwrite("Caution: no hypervisor detected from CPUID bits, but a hypervisor may be hidden.\nRefer to https://github.com/anrieff/libcpuid/issues/90#issuecomment-296568713\n"
                   ,0x9f,1,(FILE *)fout);
          }
        }
        cpuid_free_raw_data_array(&raw_array);
        cpuid_free_system_id(&data);
        return 0;
      }
      iVar11 = check_need_raw_data();
      if (iVar11 == 0) {
        poVar18 = requests;
        for (lVar20 = 0; lVar20 < iVar9; lVar20 = lVar20 + 1) {
          print_info(*poVar18,(cpu_id_t *)0x0);
          poVar18 = poVar18 + 1;
          iVar9 = num_requests;
        }
        goto LAB_001032e4;
      }
      iVar9 = cpu_identify_all(&raw_array,&data);
      __stream = _stderr;
      if (-1 < iVar9) {
        for (uVar21 = 0; uVar21 < (data._0_8_ & 0xff); uVar21 = uVar21 + 1) {
          if ((uVar21 != 0) && (raw_array.with_affinity != false)) {
            fwrite("--------------------------------------------------------------------------------\n"
                   ,0x51,1,(FILE *)fout);
          }
          poVar18 = requests;
          for (lVar20 = 0; lVar20 < num_requests; lVar20 = lVar20 + 1) {
            print_info(*poVar18,data.cpu_types + uVar21);
            poVar18 = poVar18 + 1;
          }
        }
        goto LAB_001032e4;
      }
      if (need_quiet != 0) {
        return -1;
      }
      pcVar17 = (char *)cpuid_error();
      pcVar19 = "Error identifying the CPU: %s\n";
      goto LAB_0010371a;
    }
    if (need_quiet != 0) {
      return -1;
    }
    fwrite("Cannot deserialize raw data from ",0x21,1,_stderr);
    if (raw_data_file._0_2_ == 0x2d) {
      pcVar17 = "stdin\n";
      sStack_a0 = 6;
      goto LAB_00103222;
    }
LAB_001036ed:
    fprintf(_stderr,"file `%s\'\n",raw_data_file);
  }
  __stream = _stderr;
  pcVar17 = (char *)cpuid_error();
  pcVar19 = "Error: %s\n";
LAB_0010371a:
  fprintf(__stream,pcVar19,pcVar17);
  return -1;
}

Assistant:

int main(int argc, char** argv)
{
	int parseres = parse_cmdline(argc, argv);
	int i, readres, writeres;
	int only_clock_queries;
	uint8_t cpu_type_index;
	struct cpu_raw_data_array_t raw_array = {
		.with_affinity = false,
		.num_raw       = 0,
		.raw           = NULL
	};
	struct system_id_t data = {
		.num_cpu_types = 0
	};

	if (parseres != 1)
		return parseres;

	/* In quiet mode, disable libcpuid warning messages: */
	if (need_quiet)
		cpuid_set_warn_function(NULL);

	cpuid_set_verbosiness_level(verbose_level);

	/* Redirect output, if necessary: */
	if (strcmp(out_file, "") && strcmp(out_file, "-")) {
		fout = fopen(out_file, "wt");
		if (!fout) {
			if (!need_quiet)
				fprintf(stderr, "Cannot open `%s' for writing!\n", out_file);
			return -1;
		}
		atexit(close_out);
	} else {
		fout = stdout;
	}

	/* If requested, print library version: */
	if (need_version)
		fprintf(fout, "%s\n", cpuid_lib_version());

	if (need_input) {
		/* We have a request to input raw CPUID data from file: */
		if (!strcmp(raw_data_file, "-"))
			/* Input from stdin */
			readres = cpuid_deserialize_all_raw_data(&raw_array, "");
		else
			/* Input from file */
			readres = cpuid_deserialize_all_raw_data(&raw_array, raw_data_file);
		if (readres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot deserialize raw data from ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdin\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	} else {
		if (check_need_raw_data()) {
			/* Try to obtain raw CPUID data from the CPU: */
			readres = cpuid_get_all_raw_data(&raw_array);
			if (readres < 0) {
				if (!need_quiet) {
					fprintf(stderr, "Cannot obtain raw CPU data!\n");
					fprintf(stderr, "Error: %s\n", cpuid_error());
				}
				return -1;
			}
		}
	}

	/* Need to dump raw CPUID data to file: */
	if (need_output) {
		if (!strcmp(raw_data_file, "-"))
			/* Serialize to stdout */
			writeres = cpuid_serialize_all_raw_data(&raw_array, "");
		else
			/* Serialize to file */
			writeres = cpuid_serialize_all_raw_data(&raw_array, raw_data_file);
		if (writeres < 0) {
			if (!need_quiet) {
				fprintf(stderr, "Cannot serialize raw data to ");
				if (!strcmp(raw_data_file, "-"))
					fprintf(stderr, "stdout\n");
				else
					fprintf(stderr, "file `%s'\n", raw_data_file);
				/* Print the error message */
				fprintf(stderr, "Error: %s\n", cpuid_error());
			}
			return -1;
		}
	}
	if (need_report) {
		if (verbose_level >= 1) {
			printf("Writing decoded CPU report to `%s'\n", out_file);
		}
		/*
		 * Try CPU identification
		 * (this fill the `data' structure with decoded CPU features)
		 */
		if (cpu_identify_all(&raw_array, &data) < 0)
			fprintf(fout, "Error identifying the CPU: %s\n", cpuid_error());
		else if (data.num_cpu_types == 0)
			fprintf(fout, "The cpu_types array is empty: there is nothing to report\n");
		else {
			/* Write a thorough report of cpu_id_t structure to output (usually stdout) */
			fprintf(fout, "CPUID is present\n");
			/* OK, now write what we have in `data'...: */
			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				fprintf(fout, "CPU Info for type #%d:\n------------------\n", cpu_type_index);
				fprintf(fout, "  arch       : %s\n", cpu_architecture_str(data.cpu_types[cpu_type_index].architecture));
				fprintf(fout, "  feat_level : %s\n", cpu_feature_level_str(data.cpu_types[cpu_type_index].feature_level));
				fprintf(fout, "  purpose    : %s\n", cpu_purpose_str(data.cpu_types[cpu_type_index].purpose));
				fprintf(fout, "  vendor_str : `%s'\n", data.cpu_types[cpu_type_index].vendor_str);
				fprintf(fout, "  vendor id  : %d\n", (int) data.cpu_types[cpu_type_index].vendor);
				fprintf(fout, "  brand_str  : `%s'\n", data.cpu_types[cpu_type_index].brand_str);
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  family     : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.family, data.cpu_types[cpu_type_index].x86.family);
					fprintf(fout, "  model      : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.model, data.cpu_types[cpu_type_index].x86.model);
					fprintf(fout, "  stepping   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.stepping, data.cpu_types[cpu_type_index].x86.stepping);
					fprintf(fout, "  ext_family : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_family, data.cpu_types[cpu_type_index].x86.ext_family);
					fprintf(fout, "  ext_model  : %d (%02Xh)\n", data.cpu_types[cpu_type_index].x86.ext_model, data.cpu_types[cpu_type_index].x86.ext_model);
				}
				else if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_ARM) {
					fprintf(fout, "  implementer: %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.implementer, data.cpu_types[cpu_type_index].arm.implementer);
					fprintf(fout, "  variant    : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.variant, data.cpu_types[cpu_type_index].arm.variant);
					fprintf(fout, "  part_num   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.part_num, data.cpu_types[cpu_type_index].arm.part_num);
					fprintf(fout, "  revision   : %d (%02Xh)\n", data.cpu_types[cpu_type_index].arm.revision, data.cpu_types[cpu_type_index].arm.revision);
				}
				fprintf(fout, "  num_cores  : %d\n", data.cpu_types[cpu_type_index].num_cores);
				fprintf(fout, "  num_logical: %d\n", data.cpu_types[cpu_type_index].num_logical_cpus);
				fprintf(fout, "  tot_logical: %d\n", data.cpu_types[cpu_type_index].total_logical_cpus);
				fprintf(fout, "  affi_mask  : 0x%s\n", affinity_mask_str(&data.cpu_types[cpu_type_index].affinity_mask));
				if (data.cpu_types[cpu_type_index].architecture == ARCHITECTURE_X86) {
					fprintf(fout, "  L1 D cache : %d KB\n", data.cpu_types[cpu_type_index].l1_data_cache);
					fprintf(fout, "  L1 I cache : %d KB\n", data.cpu_types[cpu_type_index].l1_instruction_cache);
					fprintf(fout, "  L2 cache   : %d KB\n", data.cpu_types[cpu_type_index].l2_cache);
					fprintf(fout, "  L3 cache   : %d KB\n", data.cpu_types[cpu_type_index].l3_cache);
					fprintf(fout, "  L4 cache   : %d KB\n", data.cpu_types[cpu_type_index].l4_cache);
					fprintf(fout, "  L1D assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_data_assoc);
					fprintf(fout, "  L1I assoc. : %d-way\n", data.cpu_types[cpu_type_index].l1_instruction_assoc);
					fprintf(fout, "  L2 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l2_assoc);
					fprintf(fout, "  L3 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l3_assoc);
					fprintf(fout, "  L4 assoc.  : %d-way\n", data.cpu_types[cpu_type_index].l4_assoc);
					fprintf(fout, "  L1D line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_data_cacheline);
					fprintf(fout, "  L1I line sz: %d bytes\n", data.cpu_types[cpu_type_index].l1_instruction_cacheline);
					fprintf(fout, "  L2 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l2_cacheline);
					fprintf(fout, "  L3 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l3_cacheline);
					fprintf(fout, "  L4 line sz : %d bytes\n", data.cpu_types[cpu_type_index].l4_cacheline);
					fprintf(fout, "  L1D inst.  : %d\n", data.cpu_types[cpu_type_index].l1_data_instances);
					fprintf(fout, "  L1I inst.  : %d\n", data.cpu_types[cpu_type_index].l1_instruction_instances);
					fprintf(fout, "  L2 inst.   : %d\n", data.cpu_types[cpu_type_index].l2_instances);
					fprintf(fout, "  L3 inst.   : %d\n", data.cpu_types[cpu_type_index].l3_instances);
					fprintf(fout, "  L4 inst.   : %d\n", data.cpu_types[cpu_type_index].l4_instances);
					fprintf(fout, "  SSE units  : %d bits (%s)\n", data.cpu_types[cpu_type_index].x86.sse_size, data.cpu_types[cpu_type_index].detection_hints[CPU_HINT_SSE_SIZE_AUTH] ? "authoritative" : "non-authoritative");
				}
				fprintf(fout, "  code name  : `%s'\n", data.cpu_types[cpu_type_index].cpu_codename);
				fprintf(fout, "  features   :");
				/*
				* Here we enumerate all CPU feature bits, and when a feature
				* is present output its name:
				*/
				for (i = 0; i < NUM_CPU_FEATURES; i++)
					if (data.cpu_types[cpu_type_index].flags[i])
						fprintf(fout, " %s", cpu_feature_str(i));
				fprintf(fout, "\n");
			}
		}

		/* Is CPU clock info requested? */
		if (need_clockreport) {
			if (need_timed_clockreport) {
				/* Here we use the RDTSC-based routine */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock_measure(400, 1));
			} else {
				/* Here we use the OS-provided info */
				fprintf(fout, "  cpu clock  : %d MHz\n",
				        cpu_clock());
			}
		}
	}
	/*
	 * Check if we have any queries to process.
	 * We have to handle the case when `--clock' or `--clock-rdtsc' options
	 * are present.
	 * If in report mode, this will generate spurious output after the
	 * report, if not handled explicitly.
	 */
	only_clock_queries = 1;
	for (i = 0; i < num_requests; i++)
		if (requests[i] != NEED_CLOCK && requests[i] != NEED_CLOCK_RDTSC) {
			only_clock_queries = 0;
			break;
		}
	/* OK, process all queries. */
	if (((!need_report || !only_clock_queries) && num_requests > 0) || need_identify) {
		if (check_need_raw_data()) {
			/* Identify the CPU. Make it do cpuid_get_all_raw_data() itself */
			if (cpu_identify_all(&raw_array, &data) < 0) {
				if (!need_quiet)
					fprintf(stderr,
							"Error identifying the CPU: %s\n",
							cpuid_error());
				return -1;
			}

			for (cpu_type_index = 0; cpu_type_index < data.num_cpu_types; cpu_type_index++) {
				if (raw_array.with_affinity && (cpu_type_index > 0))
					fprintf(fout, "--------------------------------------------------------------------------------\n");
				for (i = 0; i < num_requests; i++)
					print_info(requests[i], &data.cpu_types[cpu_type_index]);
			}
		}
		else
			for (i = 0; i < num_requests; i++)
				print_info(requests[i], NULL);
	}
	if (need_cpulist) {
		print_cpulist();
	}
	if (need_sgx) {
		print_sgx_data(&raw_array.raw[0], &data.cpu_types[0]);
	}
	if (need_hypervisor) {
		print_hypervisor(&raw_array.raw[0], &data.cpu_types[0]);
	}

	cpuid_free_raw_data_array(&raw_array);
	cpuid_free_system_id(&data);
	return 0;
}